

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

void __thiscall diff_match_patch_test::testMatchMain(diff_match_patch_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  int iVar2;
  diff_match_patch_test *pdVar3;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  wstring local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_main: Equality.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abcdef",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_main((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_main: Null text.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abcdef",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_main((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,-1,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_main: Null pattern.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_main((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,3,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_main: Exact match.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"de",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_main((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,3,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0x3f333333;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_main: Complex match.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_60,L"I am the very model of a modern major general.",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L" that berry ",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_main((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,4,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  return;
}

Assistant:

void diff_match_patch_test::testMatchMain() {
  // Full match.
  assertEquals(L"match_main: Equality.", 0, dmp.match_main(L"abcdef", L"abcdef", 1000));

  assertEquals(L"match_main: Null text.", -1, dmp.match_main(L"", L"abcdef", 1));

  assertEquals(L"match_main: Null pattern.", 3, dmp.match_main(L"abcdef", L"", 3));

  assertEquals(L"match_main: Exact match.", 3, dmp.match_main(L"abcdef", L"de", 3));

  dmp.Match_Threshold = 0.7f;
  assertEquals(L"match_main: Complex match.", 4, dmp.match_main(L"I am the very model of a modern major general.", L" that berry ", 5));
  dmp.Match_Threshold = 0.5f;
}